

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::get_accumulated_member_location
          (CompilerMSL *this,SPIRVariable *var,uint32_t mbr_idx,bool strip_array)

{
  bool bVar1;
  uint32_t uVar2;
  TypedID<(spirv_cross::Types)1> TVar3;
  TypedID *this_00;
  SPIRType *type_00;
  size_t sVar4;
  SPIRType *local_60;
  uint local_50;
  uint32_t local_4c;
  uint32_t j;
  uint32_t location_count;
  SPIRType *mbr_type;
  uint32_t i;
  uint32_t location;
  SPIRType *type;
  bool strip_array_local;
  uint32_t mbr_idx_local;
  SPIRVariable *var_local;
  CompilerMSL *this_local;
  
  if (strip_array) {
    local_60 = Compiler::get_variable_element_type((Compiler *)this,var);
  }
  else {
    local_60 = Compiler::get_variable_data_type((Compiler *)this,var);
  }
  i = Compiler::get_decoration
                ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
  for (mbr_type._4_4_ = 0; mbr_type._4_4_ < mbr_idx; mbr_type._4_4_ = mbr_type._4_4_ + 1) {
    this_00 = (TypedID *)
              VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                        (&(local_60->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                         (ulong)mbr_type._4_4_);
    uVar2 = TypedID::operator_cast_to_unsigned_int(this_00);
    type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
    TVar3 = TypedID::operator_cast_to_TypedID((TypedID *)&(local_60->super_IVariant).self);
    bVar1 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)TVar3.id,mbr_idx,DecorationLocation);
    if (bVar1) {
      TVar3 = TypedID::operator_cast_to_TypedID((TypedID *)&(local_60->super_IVariant).self);
      i = Compiler::get_member_decoration((Compiler *)this,TVar3.id,mbr_idx,DecorationLocation);
    }
    local_4c = 1;
    if (1 < type_00->columns) {
      local_4c = type_00->columns;
    }
    bVar1 = VectorView<unsigned_int>::empty(&(type_00->array).super_VectorView<unsigned_int>);
    if (!bVar1) {
      for (local_50 = 0;
          sVar4 = VectorView<unsigned_int>::size(&(type_00->array).super_VectorView<unsigned_int>),
          local_50 < (uint)sVar4; local_50 = local_50 + 1) {
        uVar2 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type_00,local_50);
        local_4c = uVar2 * local_4c;
      }
    }
    i = local_4c + i;
  }
  return i;
}

Assistant:

uint32_t CompilerMSL::get_accumulated_member_location(const SPIRVariable &var, uint32_t mbr_idx, bool strip_array)
{
	auto &type = strip_array ? get_variable_element_type(var) : get_variable_data_type(var);
	uint32_t location = get_decoration(var.self, DecorationLocation);

	for (uint32_t i = 0; i < mbr_idx; i++)
	{
		auto &mbr_type = get<SPIRType>(type.member_types[i]);

		// Start counting from any place we have a new location decoration.
		if (has_member_decoration(type.self, mbr_idx, DecorationLocation))
			location = get_member_decoration(type.self, mbr_idx, DecorationLocation);

		uint32_t location_count = 1;

		if (mbr_type.columns > 1)
			location_count = mbr_type.columns;

		if (!mbr_type.array.empty())
			for (uint32_t j = 0; j < uint32_t(mbr_type.array.size()); j++)
				location_count *= to_array_size_literal(mbr_type, j);

		location += location_count;
	}

	return location;
}